

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2.cpp
# Opt level: O1

uint16_t unorm_getFCD16_63(UChar32 c)

{
  uint16_t uVar1;
  Norm2AllModes *pNVar2;
  Normalizer2Impl *this;
  UErrorCode errorCode;
  UErrorCode local_c;
  
  local_c = U_ZERO_ERROR;
  pNVar2 = icu_63::Norm2AllModes::getNFCInstance(&local_c);
  if (pNVar2 == (Norm2AllModes *)0x0) {
    this = (Normalizer2Impl *)0x0;
  }
  else {
    this = pNVar2->impl;
  }
  if (U_ZERO_ERROR < local_c) {
    return 0;
  }
  uVar1 = icu_63::Normalizer2Impl::getFCD16(this,c);
  return uVar1;
}

Assistant:

U_CFUNC uint16_t
unorm_getFCD16(UChar32 c) {
    UErrorCode errorCode=U_ZERO_ERROR;
    const Normalizer2Impl *impl=Normalizer2Factory::getNFCImpl(errorCode);
    if(U_SUCCESS(errorCode)) {
        return impl->getFCD16(c);
    } else {
        return 0;
    }
}